

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

var __thiscall
cs::domain_manager::get_var_optimizable<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  bool bVar1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prVar2;
  size_t sVar3;
  domain_type *this_01;
  size_t sVar4;
  var_id *in_RDX;
  key_arg<std::__cxx11::basic_string<char>_> *in_RSI;
  domain_type *in_RDI;
  size_t size;
  size_t i;
  var_id *in_stack_ffffffffffffffa8;
  domain_type *this_02;
  size_t local_20;
  
  this_02 = in_RDI;
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)stack_type<cs::domain_type,_std::allocator>::size
                         ((stack_type<cs::domain_type,_std::allocator> *)(in_RSI + 6));
  prVar2 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
              ::size((stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
                      *)(in_RSI + 1));
  if (this_00 == prVar2) {
    local_20 = 0;
    sVar3 = stack_type<cs::domain_type,_std::allocator>::size
                      ((stack_type<cs::domain_type,_std::allocator> *)(in_RSI + 6));
    for (; local_20 < sVar3; local_20 = local_20 + 1) {
      this_01 = (domain_type *)
                stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
                ::operator[]((stack_type<phmap::flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator>
                              *)(in_RSI + 1),local_20);
      var_id::operator_cast_to_string_(in_RDX);
      sVar4 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashSetPolicy<std::__cxx11::string>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::count<std::__cxx11::string>(this_00,in_RSI);
      if (sVar4 != 0) {
        stack_type<cs::domain_type,_std::allocator>::operator[]
                  ((stack_type<cs::domain_type,_std::allocator> *)(in_RSI + 6),local_20);
        bVar1 = domain_type::exist(this_01,in_stack_ffffffffffffffa8);
        if (bVar1) {
          stack_type<cs::domain_type,_std::allocator>::operator[]
                    ((stack_type<cs::domain_type,_std::allocator> *)(in_RSI + 6),local_20);
          domain_type::get_var_no_check(this_02,(var_id *)in_RDI);
          cs_impl::any::any((any *)this_01,(any *)in_stack_ffffffffffffffa8);
          return (var)(proxy *)this_02;
        }
        break;
      }
    }
  }
  memset(in_RDI,0,8);
  cs_impl::any::any((any *)in_RDI);
  return (var)(proxy *)this_02;
}

Assistant:

var get_var_optimizable(T &&name)
		{
			if (m_data.size() == m_set.size()) {
				for (std::size_t i = 0, size = m_data.size(); i < size; ++i) {
					if (m_set[i].count(name) > 0) {
						if (m_data[i].exist(name))
							return m_data[i].get_var_no_check(name);
						else
							break;
					}
				}
			}
			return var();
		}